

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

char * CreateLlvmFunctionName(LlvmCompilationContext *ctx,FunctionData *function)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  MatchData *pMVar6;
  MatchData *local_40;
  MatchData *curr_1;
  char *pos;
  char *name;
  MatchData *curr;
  uint length;
  FunctionData *function_local;
  LlvmCompilationContext *ctx_local;
  char *__dest;
  
  uVar2 = InplaceStr::length(&function->name->name);
  uVar3 = InplaceStr::length(&(function->type->super_TypeBase).name);
  curr._4_4_ = uVar3 + uVar2 + 1;
  if ((function->generics).head != (MatchData *)0x0) {
    curr._4_4_ = curr._4_4_ + 1;
    for (name = (char *)(function->generics).head; name != (char *)0x0;
        name = *(char **)(name + 0x10)) {
      uVar2 = InplaceStr::length((InplaceStr *)(*(long *)(name + 8) + 0x10));
      curr._4_4_ = uVar2 + curr._4_4_;
      if (*(long *)(name + 0x10) != 0) {
        curr._4_4_ = curr._4_4_ + 1;
      }
    }
  }
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(curr._4_4_ + 1));
  __dest = (char *)CONCAT44(extraout_var,iVar4);
  pcVar1 = (function->name->name).begin;
  uVar2 = InplaceStr::length(&function->name->name);
  memcpy(__dest,pcVar1,(ulong)uVar2);
  uVar2 = InplaceStr::length(&function->name->name);
  pcVar5 = __dest + uVar2;
  *pcVar5 = '#';
  pcVar1 = (function->type->super_TypeBase).name.begin;
  uVar2 = InplaceStr::length(&(function->type->super_TypeBase).name);
  memcpy(pcVar5 + 1,pcVar1,(ulong)uVar2);
  uVar2 = InplaceStr::length(&(function->type->super_TypeBase).name);
  pMVar6 = (MatchData *)(pcVar5 + 1 + uVar2);
  curr_1 = pMVar6;
  if ((function->generics).head != (MatchData *)0x0) {
    curr_1 = (MatchData *)((long)&pMVar6->name + 1);
    *(char *)&pMVar6->name = '$';
    for (local_40 = (function->generics).head; local_40 != (MatchData *)0x0;
        local_40 = local_40->next) {
      pcVar1 = (local_40->type->name).begin;
      uVar2 = InplaceStr::length(&local_40->type->name);
      memcpy(curr_1,pcVar1,(ulong)uVar2);
      uVar2 = InplaceStr::length(&local_40->type->name);
      pMVar6 = (MatchData *)((long)&curr_1->name + (ulong)uVar2);
      curr_1 = pMVar6;
      if (local_40->next != (MatchData *)0x0) {
        curr_1 = (MatchData *)((long)&pMVar6->name + 1);
        *(undefined1 *)&pMVar6->name = 0x2c;
      }
    }
  }
  *(undefined1 *)&curr_1->name = 0;
  return __dest;
}

Assistant:

char* CreateLlvmFunctionName(LlvmCompilationContext &ctx, FunctionData *function)
{
	unsigned length = function->name->name.length();
	length++; // '#'
	length += function->type->name.length();

	if(function->generics.head)
	{
		length++; // '$'

		for(MatchData *curr = function->generics.head; curr; curr = curr->next)
		{
			length += curr->type->name.length();

			if(curr->next)
				length++; // ','
		}
	}

	char *name = (char*)ctx.allocator->alloc(length + 1);

	char *pos = name;

	memcpy(pos, function->name->name.begin, function->name->name.length());
	pos += function->name->name.length();

	*pos++ = '#';

	memcpy(pos, function->type->name.begin, function->type->name.length());
	pos += function->type->name.length();

	if(function->generics.head)
	{
		*pos++ = '$';

		for(MatchData *curr = function->generics.head; curr; curr = curr->next)
		{
			memcpy(pos, curr->type->name.begin, curr->type->name.length());
			pos += curr->type->name.length();

			if(curr->next)
				*pos++ = ',';
		}
	}

	*pos = 0;

	return name;
}